

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::increment
          (segment_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  pair<unsigned_long,_unsigned_long> pos;
  bool bVar1;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *psVar2;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *psVar3;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *in_RDI;
  pair<unsigned_long,_unsigned_long> next;
  size_t in_stack_ffffffffffffffc8;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *psVar4;
  segment_index_iterator<std::_List_iterator<wchar_t>_> *psVar5;
  
  psVar3 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)(in_RDI->current_).second;
  psVar5 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)(in_RDI->current_).first;
  psVar4 = psVar3;
  if ((in_RDI->full_select_ & 1U) == 0) {
    do {
      psVar2 = psVar4;
      psVar3 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)
               size((segment_index_iterator<std::_List_iterator<wchar_t>_> *)0x1624c7);
      bVar1 = psVar3 <= psVar4;
      psVar3 = psVar5;
      psVar4 = psVar2;
      if (bVar1) break;
      psVar4 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)
               ((long)&(psVar2->value_).
                       super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>.first
                       ._M_node + 1);
      bVar1 = valid_offset(in_RDI,in_stack_ffffffffffffffc8);
      psVar3 = psVar2;
      psVar5 = psVar2;
    } while (!bVar1);
  }
  else {
    do {
      psVar5 = psVar4;
      psVar2 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)
               size((segment_index_iterator<std::_List_iterator<wchar_t>_> *)0x16244d);
      if (psVar2 <= psVar4) break;
      psVar5 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)
               ((long)&(psVar5->value_).
                       super_pair<std::_List_iterator<wchar_t>,_std::_List_iterator<wchar_t>_>.first
                       ._M_node + 1);
      bVar1 = valid_offset(in_RDI,(size_t)psVar4);
      psVar4 = psVar5;
    } while (!bVar1);
    psVar4 = psVar5;
    psVar2 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)
             size((segment_index_iterator<std::_List_iterator<wchar_t>_> *)0x162495);
    if (psVar5 == psVar2) {
      psVar3 = (segment_index_iterator<std::_List_iterator<wchar_t>_> *)&psVar4[-1].field_0x37;
    }
  }
  pos.second = (unsigned_long)psVar4;
  pos.first = (unsigned_long)psVar3;
  update_current(psVar4,pos);
  return;
}

Assistant:

void increment()
                    {
                        std::pair<size_t,size_t> next = current_;
                        if(full_select_) {
                            next.first = next.second;
                            while(next.second < size()) {
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                            if(next.second == size())
                                next.first = next.second - 1;
                        }
                        else {
                            while(next.second < size()) {
                                next.first = next.second;
                                next.second++;
                                if(valid_offset(next.second))
                                    break;
                            }
                        }
                        update_current(next);
                    }